

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::setNumStr(UniValue *this,string *str)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = in_RDI;
  bVar1 = validNumStr(in_stack_ffffffffffffffa0);
  if (bVar1) {
    clear(in_stack_ffffffffffffff68);
    *(undefined4 *)&(in_RDI->_M_dataplus)._M_p = 4;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffb8,__rhs);
    std::operator+(in_RSI,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setNumStr(std::string str)
{
    if (!validNumStr(str)) {
        throw std::runtime_error{"The string '" + str + "' is not a valid JSON number"};
    }

    clear();
    typ = VNUM;
    val = std::move(str);
}